

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.h
# Opt level: O1

void __thiscall
spvtools::opt::ScalarReplacementPass::ScalarReplacementPass
          (ScalarReplacementPass *this,uint32_t limit)

{
  uint uVar1;
  
  MemPass::MemPass(&this->super_MemPass);
  (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)&PTR__ScalarReplacementPass_00b165e0;
  (this->pointee_to_pointer_)._M_h._M_buckets = &(this->pointee_to_pointer_)._M_h._M_single_bucket;
  (this->pointee_to_pointer_)._M_h._M_bucket_count = 1;
  (this->pointee_to_pointer_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->pointee_to_pointer_)._M_h._M_element_count = 0;
  (this->pointee_to_pointer_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->pointee_to_pointer_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->pointee_to_pointer_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->type_to_null_)._M_h._M_buckets = &(this->type_to_null_)._M_h._M_single_bucket;
  (this->type_to_null_)._M_h._M_bucket_count = 1;
  (this->type_to_null_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->type_to_null_)._M_h._M_element_count = 0;
  (this->type_to_null_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->type_to_null_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->type_to_null_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->max_num_elements_ = limit;
  uVar1 = snprintf(this->name_,0x1e,"scalar-replacement=%u",limit);
  if (uVar1 < 0x1e) {
    return;
  }
  __assert_fail("size_t(num_to_write) < sizeof(name_)",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_replacement_pass.h"
                ,0x2b,"spvtools::opt::ScalarReplacementPass::ScalarReplacementPass(uint32_t)");
}

Assistant:

ScalarReplacementPass(uint32_t limit = kDefaultLimit)
      : max_num_elements_(limit) {
    const auto num_to_write = snprintf(
        name_, sizeof(name_), "scalar-replacement=%u", max_num_elements_);
    assert(size_t(num_to_write) < sizeof(name_));
    (void)num_to_write;  // Mark as unused

#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    // ClusterFuzz/OSS-Fuzz is likely to yield examples with very large arrays.
    // This can cause timeouts and memouts during fuzzing that
    // are not classed as bugs. To avoid this noise, we set the
    // max_num_elements_ to a smaller value for fuzzing.
    max_num_elements_ =
        (max_num_elements_ > 0 && max_num_elements_ < 100 ? max_num_elements_
                                                          : 100);
#endif
  }